

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

void xmlFAParseRegExp(xmlRegParserCtxtPtr ctxt,int top)

{
  xmlRegStatePtr pxVar1;
  xmlRegStatePtr to;
  bool bVar2;
  xmlRegStatePtr end;
  xmlRegStatePtr start;
  int top_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  pxVar1 = ctxt->state;
  ctxt->end = (xmlRegStatePtr)0x0;
  xmlFAParseBranch(ctxt,(xmlRegStatePtr)0x0);
  if (top != 0) {
    ctxt->state->type = XML_REGEXP_FINAL_STATE;
  }
  if (*ctxt->cur == '|') {
    to = ctxt->state;
    while( true ) {
      bVar2 = false;
      if (*ctxt->cur == '|') {
        bVar2 = ctxt->error == 0;
      }
      if (!bVar2) break;
      ctxt->cur = ctxt->cur + 1;
      ctxt->state = pxVar1;
      ctxt->end = (xmlRegStatePtr)0x0;
      xmlFAParseBranch(ctxt,to);
    }
    if (top == 0) {
      ctxt->state = to;
      ctxt->end = to;
    }
  }
  else {
    ctxt->end = ctxt->state;
  }
  return;
}

Assistant:

static void
xmlFAParseRegExp(xmlRegParserCtxtPtr ctxt, int top) {
    xmlRegStatePtr start, end;

    /* if not top start should have been generated by an epsilon trans */
    start = ctxt->state;
    ctxt->end = NULL;
    xmlFAParseBranch(ctxt, NULL);
    if (top) {
	ctxt->state->type = XML_REGEXP_FINAL_STATE;
    }
    if (CUR != '|') {
	ctxt->end = ctxt->state;
	return;
    }
    end = ctxt->state;
    while ((CUR == '|') && (ctxt->error == 0)) {
	NEXT;
	ctxt->state = start;
	ctxt->end = NULL;
	xmlFAParseBranch(ctxt, end);
    }
    if (!top) {
	ctxt->state = end;
	ctxt->end = end;
    }
}